

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall
MlmWrap::calculateDeviceChannelInfoIndices
          (MlmWrap *this,vector<int,_std::allocator<int>_> *indices,
          vector<int,_std::allocator<int>_> *startlengths,int startbyte,int bit)

{
  int iVar1;
  value_type_conflict *pvVar2;
  reference pvVar3;
  int in_ECX;
  vector<int,_std::allocator<int>_> *in_RDX;
  size_t i;
  int gap;
  int prev;
  undefined4 in_stack_ffffffffffffffa8;
  value_type vVar4;
  value_type vVar5;
  int iVar6;
  value_type_conflict *__x;
  undefined4 in_stack_ffffffffffffffc0;
  value_type_conflict *local_38;
  int local_30;
  int local_2c;
  
  local_2c = 0;
  local_30 = 0;
  local_38 = (value_type_conflict *)0x0;
  while( true ) {
    __x = local_38;
    pvVar2 = (value_type_conflict *)std::vector<int,_std::allocator<int>_>::size(in_RDX);
    if (pvVar2 <= __x) {
      return -1;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(size_type)local_38);
    local_30 = (*pvVar3 - local_2c) + local_30;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(size_type)local_38);
    vVar4 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_38 + 1);
    local_2c = vVar4 + *pvVar3;
    iVar6 = in_ECX;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(size_type)local_38);
    vVar5 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_38 + 1);
    if (iVar6 < vVar5 + *pvVar3) break;
    local_38 = (value_type_conflict *)((long)local_38 + 2);
  }
  iVar1 = in_ECX - local_30;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar6,vVar5),
             (value_type_conflict *)CONCAT44(vVar4,in_stack_ffffffffffffffa8));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),__x);
  return local_30;
}

Assistant:

int MlmWrap::calculateDeviceChannelInfoIndices(std::vector<int> &indices, std::vector<int>& startlengths, int startbyte, int bit){
    //push back index, adjusted for analog's dataformat
    //returns the gap, which when subtracted from startbyte (start byte in trodes packet), returns the startbyte of the actual analog packet
    int prev = 0;
    int gap = 0;
    for(size_t i = 0; i < startlengths.size(); i+=2){
        gap += startlengths[i] - prev;
        prev = startlengths[i] + startlengths[i+1];
        if(startbyte < startlengths[i] + startlengths[i+1]){
            //Channel in this block. subtract total gap
            indices.push_back(startbyte - gap);
            indices.push_back(bit);
            return gap;
        }
    }
    return -1;
}